

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O2

Int64Vector * __thiscall
CoreML::Specification::SupportVectorClassifier::mutable_int64classlabels
          (SupportVectorClassifier *this)

{
  StringVector *this_00;
  
  if (this->_oneof_case_[1] == 0x65) {
    this_00 = (this->ClassLabels_).stringclasslabels_;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[1] = 0x65;
    this_00 = (StringVector *)operator_new(0x28);
    Int64Vector::Int64Vector((Int64Vector *)this_00);
    (this->ClassLabels_).int64classlabels_ = (Int64Vector *)this_00;
  }
  return (Int64Vector *)this_00;
}

Assistant:

inline ::CoreML::Specification::Int64Vector* SupportVectorClassifier::mutable_int64classlabels() {
  if (!has_int64classlabels()) {
    clear_ClassLabels();
    set_has_int64classlabels();
    ClassLabels_.int64classlabels_ = new ::CoreML::Specification::Int64Vector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.SupportVectorClassifier.int64ClassLabels)
  return ClassLabels_.int64classlabels_;
}